

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O0

int ARKStepResize(void *arkode_mem,N_Vector y0,realtype hscale,realtype t0,ARKVecResizeFn resize,
                 void *resize_data)

{
  int iVar1;
  int iVar2;
  int iVar3;
  N_Vector tmpl;
  SUNNonlinearSolver p_Var4;
  ARKodeMem in_RCX;
  long in_RSI;
  int retval;
  int i;
  sunindextype liw_diff;
  sunindextype lrw_diff;
  sunindextype liw1;
  sunindextype lrw1;
  SUNNonlinearSolver NLS;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeMem *in_stack_ffffffffffffff88;
  sunindextype in_stack_ffffffffffffff90;
  sunindextype in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  int iVar5;
  int iVar6;
  realtype in_stack_ffffffffffffffb0;
  realtype in_stack_ffffffffffffffb8;
  ARKodeMem in_stack_ffffffffffffffc0;
  uint local_4;
  
  local_4 = arkStep_AccessStepMem
                      ((void *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                       (char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                       in_stack_ffffffffffffff88,(ARKodeARKStepMem *)0xe8c14f);
  if (local_4 == 0) {
    iVar5 = 0;
    iVar6 = 0;
    if (*(long *)(*(long *)(in_RSI + 8) + 0x20) != 0) {
      N_VSpace((N_Vector)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (sunindextype *)in_stack_ffffffffffffff88,(sunindextype *)0xe8c19b);
    }
    iVar1 = iVar6 - in_stack_ffffffffffffffc0->lrw1;
    iVar2 = iVar5 - in_stack_ffffffffffffffc0->liw1;
    in_stack_ffffffffffffffc0->lrw1 = iVar6;
    in_stack_ffffffffffffffc0->liw1 = iVar5;
    local_4 = arkResize(in_RCX,(N_Vector)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                        in_stack_ffffffffffffffb0,(ARKVecResizeFn)CONCAT44(iVar6,iVar5),
                        (void *)CONCAT44(iVar1,iVar2));
    if (local_4 == 0) {
      iVar3 = arkResizeVec((ARKodeMem)CONCAT44(iVar6,iVar5),(ARKVecResizeFn)CONCAT44(iVar1,iVar2),
                           (void *)((ulong)in_stack_ffffffffffffff9c << 0x20),
                           in_stack_ffffffffffffff94,in_stack_ffffffffffffff90,
                           (N_Vector)((long)in_stack_ffffffffffffffb8 + 0x38),
                           (N_Vector *)in_stack_ffffffffffffffc0);
      if (iVar3 == 0) {
        arkProcessError(in_stack_ffffffffffffffc0,-0x14,"ARKode::ARKStep","ARKStepResize",
                        "Unable to resize vector");
        local_4 = 0xffffffec;
      }
      else {
        iVar3 = arkResizeVec((ARKodeMem)CONCAT44(iVar6,iVar5),(ARKVecResizeFn)CONCAT44(iVar1,iVar2),
                             (void *)CONCAT44(in_stack_ffffffffffffff9c,local_4),
                             in_stack_ffffffffffffff94,in_stack_ffffffffffffff90,
                             (N_Vector)((long)in_stack_ffffffffffffffb8 + 0x40),
                             (N_Vector *)in_stack_ffffffffffffffc0);
        if (iVar3 == 0) {
          arkProcessError(in_stack_ffffffffffffffc0,-0x14,"ARKode::ARKStep","ARKStepResize",
                          "Unable to resize vector");
          local_4 = 0xffffffec;
        }
        else {
          tmpl = (N_Vector)((long)in_stack_ffffffffffffffb8 + 0x48);
          iVar3 = arkResizeVec((ARKodeMem)CONCAT44(iVar6,iVar5),
                               (ARKVecResizeFn)CONCAT44(iVar1,iVar2),
                               (void *)CONCAT44(in_stack_ffffffffffffff9c,local_4),
                               in_stack_ffffffffffffff94,in_stack_ffffffffffffff90,tmpl,
                               (N_Vector *)in_stack_ffffffffffffffc0);
          if (iVar3 == 0) {
            arkProcessError(in_stack_ffffffffffffffc0,-0x14,"ARKode::ARKStep","ARKStepResize",
                            "Unable to resize vector");
            local_4 = 0xffffffec;
          }
          else {
            if (*(long *)((long)in_stack_ffffffffffffffb8 + 0x28) != 0) {
              for (in_stack_ffffffffffffff9c = 0;
                  (int)in_stack_ffffffffffffff9c < *(int *)((long)in_stack_ffffffffffffffb8 + 0x5c);
                  in_stack_ffffffffffffff9c = in_stack_ffffffffffffff9c + 1) {
                tmpl = (N_Vector)
                       (*(long *)((long)in_stack_ffffffffffffffb8 + 0x28) +
                       (long)(int)in_stack_ffffffffffffff9c * 8);
                iVar3 = arkResizeVec((ARKodeMem)CONCAT44(iVar6,iVar5),
                                     (ARKVecResizeFn)CONCAT44(iVar1,iVar2),
                                     (void *)CONCAT44(in_stack_ffffffffffffff9c,local_4),
                                     in_stack_ffffffffffffff94,in_stack_ffffffffffffff90,tmpl,
                                     (N_Vector *)in_stack_ffffffffffffffc0);
                if (iVar3 == 0) {
                  arkProcessError(in_stack_ffffffffffffffc0,-0x14,"ARKode::ARKStep","ARKStepResize",
                                  "Unable to resize vector");
                  return -0x14;
                }
              }
            }
            if (*(long *)((long)in_stack_ffffffffffffffb8 + 0x30) != 0) {
              for (in_stack_ffffffffffffff9c = 0;
                  (int)in_stack_ffffffffffffff9c < *(int *)((long)in_stack_ffffffffffffffb8 + 0x5c);
                  in_stack_ffffffffffffff9c = in_stack_ffffffffffffff9c + 1) {
                tmpl = (N_Vector)
                       (*(long *)((long)in_stack_ffffffffffffffb8 + 0x30) +
                       (long)(int)in_stack_ffffffffffffff9c * 8);
                iVar3 = arkResizeVec((ARKodeMem)CONCAT44(iVar6,iVar5),
                                     (ARKVecResizeFn)CONCAT44(iVar1,iVar2),
                                     (void *)CONCAT44(in_stack_ffffffffffffff9c,local_4),
                                     in_stack_ffffffffffffff94,in_stack_ffffffffffffff90,tmpl,
                                     (N_Vector *)in_stack_ffffffffffffffc0);
                if (iVar3 == 0) {
                  arkProcessError(in_stack_ffffffffffffffc0,-0x14,"ARKode::ARKStep","ARKStepResize",
                                  "Unable to resize vector");
                  return -0x14;
                }
              }
            }
            if ((*(long *)((long)in_stack_ffffffffffffffb8 + 0x78) != 0) &&
               (*(int *)((long)in_stack_ffffffffffffffb8 + 0x80) != 0)) {
              iVar3 = SUNNonlinSolFree((SUNNonlinearSolver)tmpl);
              if (iVar3 != 0) {
                return iVar3;
              }
              *(undefined8 *)((long)in_stack_ffffffffffffffb8 + 0x78) = 0;
              *(undefined4 *)((long)in_stack_ffffffffffffffb8 + 0x80) = 0;
              p_Var4 = SUNNonlinSol_Newton((N_Vector)((ulong)in_stack_ffffffffffffff9c << 0x20),
                                           (SUNContext)
                                           CONCAT44(in_stack_ffffffffffffff94,
                                                    in_stack_ffffffffffffff90));
              if (p_Var4 == (SUNNonlinearSolver)0x0) {
                arkProcessError(in_stack_ffffffffffffffc0,-0x14,"ARKode::ARKStep","ARKStepResize",
                                "Error creating default Newton solver");
                return -0x14;
              }
              iVar5 = ARKStepSetNonlinearSolver
                                ((void *)CONCAT44(iVar6,iVar5),
                                 (SUNNonlinearSolver)CONCAT44(iVar1,iVar2));
              if (iVar5 != 0) {
                arkProcessError(in_stack_ffffffffffffffc0,-0x14,"ARKode::ARKStep","ARKStepResize",
                                "Error attaching default Newton solver");
                return -0x14;
              }
              *(undefined4 *)((long)in_stack_ffffffffffffffb8 + 0x80) = 1;
            }
            if (*(long *)((long)in_stack_ffffffffffffffb8 + 0x78) != 0) {
              *(undefined8 *)((long)in_stack_ffffffffffffffb8 + 0x180) = 0;
            }
            local_4 = 0;
          }
        }
      }
    }
    else {
      arkProcessError(in_stack_ffffffffffffffc0,(int)(ulong)local_4,"ARKode::ARKStep",
                      "ARKStepResize","Unable to resize main ARKode infrastructure");
    }
  }
  return local_4;
}

Assistant:

int ARKStepResize(void *arkode_mem, N_Vector y0, realtype hscale,
                  realtype t0, ARKVecResizeFn resize, void *resize_data)
{
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  SUNNonlinearSolver NLS;
  sunindextype lrw1, liw1, lrw_diff, liw_diff;
  int i, retval;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(arkode_mem, "ARKStepResize",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* Determing change in vector sizes */
  lrw1 = liw1 = 0;
  if (y0->ops->nvspace != NULL)
    N_VSpace(y0, &lrw1, &liw1);
  lrw_diff = lrw1 - ark_mem->lrw1;
  liw_diff = liw1 - ark_mem->liw1;
  ark_mem->lrw1 = lrw1;
  ark_mem->liw1 = liw1;

  /* resize ARKode infrastructure memory */
  retval = arkResize(ark_mem, y0, hscale, t0, resize, resize_data);
  if (retval != ARK_SUCCESS) {
    arkProcessError(ark_mem, retval, "ARKode::ARKStep", "ARKStepResize",
                    "Unable to resize main ARKode infrastructure");
    return(retval);
  }

  /* Resize the sdata, zpred and zcor vectors */
  if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff,
                    liw_diff, y0, &step_mem->sdata)) {
    arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode::ARKStep", "ARKStepResize",
                    "Unable to resize vector");
    return(ARK_MEM_FAIL);
  }

  if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff,
                    liw_diff, y0, &step_mem->zpred)) {
    arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode::ARKStep", "ARKStepResize",
                    "Unable to resize vector");
    return(ARK_MEM_FAIL);
  }

  if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff,
                    liw_diff, y0, &step_mem->zcor)) {
    arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode::ARKStep", "ARKStepResize",
                    "Unable to resize vector");
    return(ARK_MEM_FAIL);
  }

  /* Resize the ARKStep vectors */
  /*     Fe */
  if (step_mem->Fe != NULL) {
    for (i=0; i<step_mem->stages; i++) {
      if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff,
                        liw_diff, y0, &step_mem->Fe[i])) {
        arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode::ARKStep", "ARKStepResize",
                        "Unable to resize vector");
        return(ARK_MEM_FAIL);
      }
    }
  }
  /*     Fi */
  if (step_mem->Fi != NULL) {
    for (i=0; i<step_mem->stages; i++) {
      if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff,
                        liw_diff, y0, &step_mem->Fi[i])) {
        arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode::ARKStep", "ARKStepResize",
                        "Unable to resize vector");
        return(ARK_MEM_FAIL);
      }
    }
  }

  /* If a NLS object was previously used, destroy and recreate default Newton
     NLS object (can be replaced by user-defined object if desired) */
  if ((step_mem->NLS != NULL) && (step_mem->ownNLS)) {

    /* destroy existing NLS object */
    retval = SUNNonlinSolFree(step_mem->NLS);
    if (retval != ARK_SUCCESS)  return(retval);
    step_mem->NLS = NULL;
    step_mem->ownNLS = SUNFALSE;

    /* create new Newton NLS object */
    NLS = SUNNonlinSol_Newton(y0, ark_mem->sunctx);
    if (NLS == NULL) {
      arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode::ARKStep",
                      "ARKStepResize", "Error creating default Newton solver");
      return(ARK_MEM_FAIL);
    }

    /* attach new Newton NLS object to ARKStep */
    retval = ARKStepSetNonlinearSolver(ark_mem, NLS);
    if (retval != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode::ARKStep",
                      "ARKStepResize", "Error attaching default Newton solver");
      return(ARK_MEM_FAIL);
    }
    step_mem->ownNLS = SUNTRUE;

  }

  /* reset nonlinear solver counters */
  if (step_mem->NLS != NULL)  step_mem->nsetups = 0;

  return(ARK_SUCCESS);
}